

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  int iVar11;
  type tVar12;
  result rVar13;
  ulong uVar14;
  byte bVar15;
  undefined8 extraout_RDX;
  long lVar16;
  buffer<char> *this;
  uint uVar17;
  long lVar18;
  uint64_t uVar19;
  ulong uVar20;
  ulong uVar21;
  uint64_t uVar22;
  ulong uVar23;
  boundaries bVar24;
  fp fVar25;
  fp fVar26;
  ulong uStack_b0;
  int exp;
  int cached_exp10;
  uint64_t local_90;
  buffer<char> *local_88;
  fp local_80;
  fixed_handler handler;
  fp local_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x431,"value is negative");
  }
  uVar21 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar21 == 0x200000000) {
      tVar12 = to_unsigned<int>(precision);
      buffer<char>::resize(buf,(ulong)tVar12);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar11 = snprintf_float<double>(value,precision,specs,buf);
    return iVar11;
  }
  exp = 0;
  cached_exp10 = 0;
  local_90 = 1;
  if (precision < 0) {
    local_80.f = 0;
    local_80.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_88 = buf;
      bVar24 = fp::assign_with_boundaries<double>(&local_80,value);
    }
    else {
      local_88 = buf;
      bVar24 = fp::assign_float_with_boundaries<double>(&local_80,value);
    }
    fVar25._8_8_ = bVar24.upper;
    fVar25.f = (ulong)(uint)local_80.e;
    fVar26 = normalize<0>((detail *)local_80.f,fVar25);
    local_80.f = fVar26.f;
    local_80.e = fVar26.e;
    fVar26 = get_cached_power(-0x7c - local_80.e,&cached_exp10);
    uVar21 = fVar26.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar21;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_80.f;
    local_80.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    iVar11 = fVar26.e + local_80.e + 0x40;
    if (0x1c < fVar26.e + local_80.e + 0x7cU) {
      local_80.e = iVar11;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x451,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar21;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = fVar25._8_8_;
    lVar16 = SUB168(auVar4 * auVar8,8);
    lVar18 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
    uVar20 = lVar16 + lVar18 + 1;
    bVar15 = -(char)iVar11;
    uVar19 = 1L << (bVar15 & 0x3f);
    uVar23 = uVar20 >> (bVar15 & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = bVar24.lower;
    handler.buf = local_88->ptr_;
    handler._16_8_ = uVar20 - local_80.f;
    handler.size = 0;
    local_80.e = iVar11;
    if ((uint32_t)uVar23 == 0) {
LAB_00110870:
      handler.size = 0;
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x330,"");
    }
    uVar22 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar16 + lVar18 + 2
    ;
    uVar21 = uVar19 - 1;
    uVar20 = uVar20 & uVar21;
    local_90 = uVar19;
    exp = grisu_count_digits((uint32_t)uVar23);
    do {
      uVar17 = exp - 1;
      switch((ulong)uVar17) {
      case 0:
        cVar10 = (char)uVar23;
        uVar23 = 0;
        goto LAB_00110706;
      case 1:
        uStack_b0 = 10;
        break;
      case 2:
        uStack_b0 = 100;
        break;
      case 3:
        uStack_b0 = 1000;
        break;
      case 4:
        uStack_b0 = 10000;
        break;
      case 5:
        uStack_b0 = 100000;
        break;
      case 6:
        uStack_b0 = 1000000;
        break;
      case 7:
        uStack_b0 = 10000000;
        break;
      case 8:
        uStack_b0 = 100000000;
        break;
      case 9:
        uStack_b0 = 1000000000;
        break;
      default:
        goto switchD_00110445_default;
      }
      cVar10 = (char)((uVar23 & 0xffffffff) / uStack_b0);
      uVar23 = (uVar23 & 0xffffffff) % uStack_b0;
LAB_00110706:
      exp = uVar17;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar10 + '0',
                          *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar17 * 8) <<
                          (bVar15 & 0x3f),(uVar23 << (bVar15 & 0x3f)) + uVar20,uVar22,uVar17,true);
      uVar19 = local_90;
      if (rVar13 != more) goto LAB_0011079f;
    } while (0 < exp);
    do {
      uVar23 = uVar20 * 10;
      uVar22 = uVar22 * 10;
      uVar20 = uVar23 & uVar21;
      exp = exp + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar23 >> (bVar15 & 0x3f)) + '0'
                          ,uVar19,uVar20,uVar22,exp,false);
    } while (rVar13 == more);
LAB_0011079f:
    this = local_88;
    if (rVar13 == error) {
      exp = exp + handler.size + ~cached_exp10;
      fallback_format<double>(value,local_88,&exp);
      return exp;
    }
    uVar17 = to_unsigned<int>(handler.size);
LAB_00110822:
    buffer<char>::resize(this,(ulong)uVar17);
    iVar11 = exp - cached_exp10;
  }
  else {
    if ((uint)precision < 0x12) {
      local_88 = buf;
      fp::assign<double,_0>(&local_40,value);
      fVar26.f = (ulong)(uint)local_40.e;
      fVar26._8_8_ = extraout_RDX;
      fVar25 = normalize<0>((detail *)local_40.f,fVar26);
      fVar26 = get_cached_power(-0x7c - fVar25.e,&cached_exp10);
      handler.buf = local_88->ptr_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar26.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar25.f;
      handler.size = 0;
      uVar20 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      cVar10 = (char)fVar26.e + (char)fVar25.e;
      bVar15 = -cVar10;
      local_90 = local_90 << (bVar15 & 0x3f);
      handler.fixed = uVar21 == 0x200000000;
      handler.exp10 = -cached_exp10;
      uVar23 = uVar20 >> (bVar15 & 0x3f);
      handler.precision = precision;
      if ((uint32_t)uVar23 == 0) goto LAB_00110870;
      if (uVar23 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x331,"");
      }
      bVar15 = -cVar10 - 0x40;
      exp = grisu_count_digits((uint32_t)uVar23);
      rVar13 = fixed_handler::on_start
                         (&handler,*(long *)(
                                            "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                            + (long)exp * 8 + 0x18) << (bVar15 & 0x3f),uVar20 / 10,
                          10,&exp);
      if (rVar13 == more) {
        uVar14 = local_90 - 1;
        uVar20 = uVar20 & uVar14;
        uVar19 = 1;
        do {
          uVar17 = exp - 1;
          switch((ulong)uVar17) {
          case 0:
            cVar10 = (char)uVar23;
            uVar23 = 0;
            goto LAB_001104b9;
          case 1:
            uStack_b0 = 10;
            break;
          case 2:
            uStack_b0 = 100;
            break;
          case 3:
            uStack_b0 = 1000;
            break;
          case 4:
            uStack_b0 = 10000;
            break;
          case 5:
            uStack_b0 = 100000;
            break;
          case 6:
            uStack_b0 = 1000000;
            break;
          case 7:
            uStack_b0 = 10000000;
            break;
          case 8:
            uStack_b0 = 100000000;
            break;
          case 9:
            uStack_b0 = 1000000000;
            break;
          default:
switchD_00110445_default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
                        ,0x363,"invalid number of digits");
          }
          cVar10 = (char)((uVar23 & 0xffffffff) / uStack_b0);
          uVar23 = (uVar23 & 0xffffffff) % uStack_b0;
LAB_001104b9:
          exp = uVar17;
          rVar13 = fixed_handler::on_digit
                             (&handler,cVar10 + '0',
                              *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar17 * 8) <<
                              (bVar15 & 0x3f),(uVar23 << (bVar15 & 0x3f)) + uVar20,1,uVar17,true);
          uVar22 = local_90;
          if (rVar13 != more) goto LAB_00110554;
        } while (0 < exp);
        do {
          uVar23 = uVar20 * 10;
          uVar19 = uVar19 * 10;
          uVar20 = uVar23 & uVar14;
          exp = exp + -1;
          rVar13 = fixed_handler::on_digit
                             (&handler,(char)(uVar23 >> (bVar15 & 0x3f)) + '0',uVar22,uVar20,uVar19,
                              exp,false);
        } while (rVar13 == more);
      }
LAB_00110554:
      this = local_88;
      buf = local_88;
      if (rVar13 != error) {
        uVar23 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar21 != 0x200000000) {
          uVar23 = (ulong)(uint)handler.size;
          do {
            iVar11 = exp + 1;
            if (local_88->ptr_[uVar23 - 1] != '0') goto LAB_00110818;
            bVar1 = 1 < uVar23;
            uVar23 = uVar23 - 1;
            exp = iVar11;
          } while (bVar1);
          uVar23 = 0;
        }
LAB_00110818:
        uVar17 = to_unsigned<int>((int)uVar23);
        goto LAB_00110822;
      }
    }
    iVar11 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar11;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}